

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_search.c
# Opt level: O2

size_t ares_name_label_cnt(char *name)

{
  long lVar1;
  
  lVar1 = 0;
  if (name == (char *)0x0) {
    return 0;
  }
  do {
    if (*name == '.') {
      lVar1 = lVar1 + 1;
    }
    else if (*name == '\0') {
      return lVar1 + 1;
    }
    name = name + 1;
  } while( true );
}

Assistant:

size_t ares_name_label_cnt(const char *name)
{
  const char *p;
  size_t      ndots = 0;

  if (name == NULL) {
    return 0;
  }

  for (p = name; p != NULL && *p != 0; p++) {
    if (*p == '.') {
      ndots++;
    }
  }

  /* Label count is 1 greater than ndots */
  return ndots + 1;
}